

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

Promise<void> __thiscall kj::UnixEventPort::FdObserver::whenBecomesReadable(FdObserver *this)

{
  Own<kj::PromiseFulfiller<void>_> *t;
  Promise<void> *pPVar1;
  PromiseNode *extraout_RDX;
  long in_RSI;
  Promise<void> PVar2;
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> local_60;
  undefined1 local_50 [8];
  PromiseFulfillerPair<void> paf;
  Fault local_20;
  Fault f;
  FdObserver *this_local;
  
  if ((*(uint *)(in_RSI + 0xc) & 1) != 0) {
    newPromiseAndFulfiller<void>();
    t = mv<kj::Own<kj::PromiseFulfiller<void>>>
                  ((Own<kj::PromiseFulfiller<void>_> *)&paf.promise.super_PromiseBase.node.ptr);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::Maybe(&local_60,t);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::operator=
              ((Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)(in_RSI + 0x10),&local_60);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::~Maybe(&local_60);
    pPVar1 = mv<kj::Promise<void>>((Promise<void> *)local_50);
    Promise<void>::Promise((Promise<void> *)this,pPVar1);
    PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_50);
    PVar2.super_PromiseBase.node.ptr = extraout_RDX;
    PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
    return (Promise<void>)PVar2.super_PromiseBase.node;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
             ,0x180,FAILED,"flags & OBSERVE_READ","\"FdObserver was not set to observe reads.\"",
             (char (*) [41])"FdObserver was not set to observe reads.");
  _::Debug::Fault::fatal(&local_20);
}

Assistant:

Promise<void> UnixEventPort::FdObserver::whenBecomesReadable() {
  KJ_REQUIRE(flags & OBSERVE_READ, "FdObserver was not set to observe reads.");

  auto paf = newPromiseAndFulfiller<void>();
  readFulfiller = kj::mv(paf.fulfiller);
  return kj::mv(paf.promise);
}